

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_message.c
# Opt level: O2

MQTT_MESSAGE * create_msg_object(uint16_t packetId,QOS_VALUE qosValue)

{
  MQTT_MESSAGE *pMVar1;
  LOGGER_LOG p_Var2;
  
  pMVar1 = (MQTT_MESSAGE *)calloc(1,0x40);
  if (pMVar1 == (MQTT_MESSAGE *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_message.c"
                ,"create_msg_object",0x29,1,"Failure unable to allocate MQTT Message.");
    }
  }
  else {
    pMVar1->packetId = packetId;
    pMVar1->qosInfo = qosValue;
  }
  return pMVar1;
}

Assistant:

static MQTT_MESSAGE* create_msg_object(uint16_t packetId, QOS_VALUE qosValue)
{
    MQTT_MESSAGE* result;
    result = (MQTT_MESSAGE*)malloc(sizeof(MQTT_MESSAGE));
    if (result != NULL)
    {
        memset(result, 0, sizeof(MQTT_MESSAGE));
        result->packetId = packetId;
        result->isDuplicateMsg = false;
        result->isMessageRetained = false;
        result->qosInfo = qosValue;
    }
    else
    {
        LogError("Failure unable to allocate MQTT Message.");
    }
    return result;
}